

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void __thiscall IRBuilderAsmJs::BuildEmpty(IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset)

{
  Func *pFVar1;
  code *pcVar2;
  byte bVar3;
  bool bVar4;
  Which WVar5;
  AsmJsType asmType;
  RegSlot RVar6;
  Instr *pIVar7;
  IndirOpnd *this_00;
  RegOpnd *pRVar8;
  undefined4 *puVar9;
  IRType IVar10;
  undefined6 in_register_00000032;
  IRBuilderAsmJs *this_01;
  int iVar11;
  undefined1 local_3c [4];
  anon_union_2_4_ea848c7b_for_ValueType_13 local_38;
  IRType local_35;
  uint32 local_34;
  ValueType vType;
  IRType irType;
  
  Js::ByteCodeReader::Empty(&this->m_jnReader);
  iVar11 = (int)CONCAT62(in_register_00000032,newOpcode);
  if (0x12 < iVar11) {
    if (iVar11 == 0x10b) {
      pIVar7 = IR::Instr::New(ThrowRuntimeError,this->m_func);
      this_00 = (IndirOpnd *)IR::IntConstOpnd::New(0x1b59,TyInt32,pIVar7->m_func,false);
    }
    else {
      if (iVar11 != 0x13) goto LAB_004f2c15;
      pIVar7 = IR::Instr::New(ArrayDetachedCheck,this->m_func);
      pRVar8 = BuildSrcOpnd(this,2,TyVar);
      this_00 = IR::IndirOpnd::New(pRVar8,0x20,TyInt8,this->m_func,false);
    }
    if (pIVar7->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar4) goto LAB_004f2f81;
      *puVar9 = 0;
    }
    pFVar1 = pIVar7->m_func;
    local_34 = offset;
    if ((this_00->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar4) goto LAB_004f2f81;
      *puVar9 = 0;
    }
    bVar3 = (this_00->super_Opnd).field_0xb;
    if ((bVar3 & 2) != 0) {
      this_00 = (IndirOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar1);
      bVar3 = (this_00->super_Opnd).field_0xb;
    }
    (this_00->super_Opnd).field_0xb = bVar3 | 2;
    pIVar7->m_src1 = &this_00->super_Opnd;
    AddInstr(this,pIVar7,local_34);
    return;
  }
  if (iVar11 == 7) {
    return;
  }
  if (iVar11 != 8) {
LAB_004f2c15:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x4a2,"((0))","(0)");
    if (bVar4) {
      *puVar9 = 0;
      return;
    }
    goto LAB_004f2f81;
  }
  pIVar7 = IR::Instr::New(Ret,this->m_func);
  WVar5 = AsmJsJITInfo::GetRetType(this->m_asmFuncInfo);
  switch(WVar5) {
  case Int64:
    local_34 = offset;
    RVar6 = GetRegSlotFromTypedReg(this,0,INT64);
    IVar10 = TyInt64;
    break;
  case Double:
    local_34 = offset;
    RVar6 = GetRegSlotFromTypedReg(this,0,FLOAT64);
    IVar10 = TyFloat64;
    goto LAB_004f2e68;
  case Float:
    local_34 = offset;
    RVar6 = GetRegSlotFromTypedReg(this,0,FLOAT32);
    IVar10 = TyFloat32;
LAB_004f2e68:
    pRVar8 = BuildDstOpnd(this,RVar6,IVar10);
    local_38.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x108;
    goto LAB_004f2e7d;
  case 4:
  case 5:
  case 6:
  case Floatish:
  case 8:
  case Fixnum:
    goto switchD_004f2ba4_caseD_4;
  case Signed:
    local_34 = offset;
    RVar6 = GetRegSlotFromTypedReg(this,0,INT32);
    IVar10 = TyInt32;
    break;
  default:
    local_34 = offset;
    if (WVar5 == Void) goto LAB_004f2f64;
    goto switchD_004f2ba4_caseD_4;
  }
  pRVar8 = BuildDstOpnd(this,RVar6,IVar10);
  local_38.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       ValueType::GetInt(false);
LAB_004f2e7d:
  IR::Opnd::SetValueType(&pRVar8->super_Opnd,(ValueType)local_38.field_0);
  if (pIVar7->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_004f2f81;
    *puVar9 = 0;
  }
  pFVar1 = pIVar7->m_func;
  if ((pRVar8->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) {
LAB_004f2f81:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar9 = 0;
  }
  bVar3 = (pRVar8->super_Opnd).field_0xb;
  if ((bVar3 & 2) != 0) {
    pRVar8 = (RegOpnd *)IR::Opnd::Copy(&pRVar8->super_Opnd,pFVar1);
    bVar3 = (pRVar8->super_Opnd).field_0xb;
  }
  (pRVar8->super_Opnd).field_0xb = bVar3 | 2;
  pIVar7->m_src1 = &pRVar8->super_Opnd;
LAB_004f2f64:
  AddInstr(this,pIVar7,local_34);
  return;
switchD_004f2ba4_caseD_4:
  local_34 = offset;
  ValueType::ValueType((ValueType *)&local_38.field_0);
  WVar5 = AsmJsJITInfo::GetRetType(this->m_asmFuncInfo);
  this_01 = (IRBuilderAsmJs *)local_3c;
  Js::AsmJsRetType::AsmJsRetType((AsmJsRetType *)this_01,WVar5);
  asmType = Js::AsmJsRetType::toType((AsmJsRetType *)this_01);
  GetSimdTypesFromAsmType(this_01,asmType.which_,&local_35,(ValueType *)&local_38.field_0);
  RVar6 = GetRegSlotFromTypedReg(this,0,SIMD);
  pRVar8 = BuildDstOpnd(this,RVar6,local_35);
  goto LAB_004f2e7d;
}

Assistant:

void
IRBuilderAsmJs::BuildEmpty(Js::OpCodeAsmJs newOpcode, uint32 offset)
{
    m_jnReader.Empty();

    IR::Instr * instr = nullptr;
    IR::RegOpnd * regOpnd = nullptr;
    Js::RegSlot retSlot;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::CheckHeap:
        instr = IR::Instr::New(Js::OpCode::ArrayDetachedCheck, m_func);
        instr->SetSrc1(IR::IndirOpnd::New(BuildSrcOpnd(AsmJsRegSlots::ArrayReg, TyVar), Js::ArrayBuffer::GetIsDetachedOffset(), TyInt8, m_func));
        AddInstr(instr, offset);
        break;
    case Js::OpCodeAsmJs::Unreachable_Void:
        instr = IR::Instr::New(Js::OpCode::ThrowRuntimeError, m_func);
        instr->SetSrc1(IR::IntConstOpnd::New(SCODE_CODE(WASMERR_Unreachable), TyInt32, instr->m_func));
        AddInstr(instr, offset);
        break;
    case Js::OpCodeAsmJs::Ret:
        instr = IR::Instr::New(Js::OpCode::Ret, m_func);

        switch (m_asmFuncInfo->GetRetType())
        {
        case Js::AsmJsRetType::Which::Signed:
            retSlot = GetRegSlotFromIntReg(0);
            regOpnd = BuildDstOpnd(retSlot, TyInt32);
            regOpnd->SetValueType(ValueType::GetInt(false));
            break;

        case Js::AsmJsRetType::Which::Float:
            retSlot = GetRegSlotFromFloatReg(0);
            regOpnd = BuildDstOpnd(retSlot, TyFloat32);
            regOpnd->SetValueType(ValueType::Float);
            break;

        case Js::AsmJsRetType::Which::Double:
            retSlot = GetRegSlotFromDoubleReg(0);
            regOpnd = BuildDstOpnd(retSlot, TyFloat64);
            regOpnd->SetValueType(ValueType::Float);
            break;

        case Js::AsmJsVarType::Which::Int64:
            retSlot = GetRegSlotFromInt64Reg(0);
            regOpnd = BuildDstOpnd(retSlot, TyInt64);
            regOpnd->SetValueType(ValueType::GetInt(false));
            break;

        case Js::AsmJsRetType::Which::Void:
            break;

        default:
        {
            IRType irType;
            ValueType vType;
            GetSimdTypesFromAsmType(Js::AsmJsRetType(m_asmFuncInfo->GetRetType()).toType().GetWhich(), &irType, &vType);
            retSlot = GetRegSlotFromSimd128Reg(0);
            regOpnd = BuildDstOpnd(retSlot, irType);
            regOpnd->SetValueType(vType);
        }

        }
        if (regOpnd)
        {
            instr->SetSrc1(regOpnd);
        }
        AddInstr(instr, offset);
        break;

    case Js::OpCodeAsmJs::Label:
        // NOP
        break;

    default:
        Assume(UNREACHED);
    }
}